

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 uVar7;
  long lVar8;
  uint index;
  ulong uVar9;
  long lVar10;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar9 = r->_begin;
  uVar11 = r->_end;
  if (uVar9 < uVar11) {
    auVar12._8_4_ = 0xff800000;
    auVar12._0_8_ = 0xff800000ff800000;
    auVar12._12_4_ = 0xff800000;
    auVar13 = ZEXT1664(auVar12);
    auVar14._8_4_ = 0x7f800000;
    auVar14._0_8_ = 0x7f8000007f800000;
    auVar14._12_4_ = 0x7f800000;
    auVar15 = ZEXT1664(auVar14);
    sVar5 = 0;
    auVar22._8_4_ = 0xddccb9a2;
    auVar22._0_8_ = 0xddccb9a2ddccb9a2;
    auVar22._12_4_ = 0xddccb9a2;
    auVar23._8_4_ = 0x5dccb9a2;
    auVar23._0_8_ = 0x5dccb9a25dccb9a2;
    auVar23._12_4_ = 0x5dccb9a2;
    auVar18 = ZEXT1664(auVar14);
    auVar21 = ZEXT1664(auVar12);
    do {
      pBVar1 = (this->super_Points).vertices.items;
      sVar6 = k;
      if ((uVar9 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
        lVar8 = (uVar9 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
        pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
        if (0.0 <= *(float *)(pcVar2 + lVar8 + 0xc)) {
          auVar12 = *(undefined1 (*) [16])(pcVar2 + lVar8);
          auVar14 = vcmpps_avx(auVar12,auVar22,2);
          auVar12 = vcmpps_avx(auVar12,auVar23,5);
          auVar12 = vorps_avx(auVar14,auVar12);
          uVar7 = vmovmskps_avx(auVar12);
          if ((char)uVar7 == '\0') {
            lVar8 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
            lVar10 = *(long *)&(this->super_Points).field_0x68 * uVar9;
            auVar12 = *(undefined1 (*) [16])(lVar8 + lVar10);
            auVar14 = ZEXT416((uint)(*(float *)(lVar8 + 0xc + lVar10) *
                                    (this->super_Points).maxRadiusScale));
            auVar14 = vshufps_avx(auVar14,auVar14,0);
            auVar24 = vsubps_avx(auVar12,auVar14);
            aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar24,ZEXT416(geomID),0x30);
            auVar24._0_4_ = auVar12._0_4_ + auVar14._0_4_;
            auVar24._4_4_ = auVar12._4_4_ + auVar14._4_4_;
            auVar24._8_4_ = auVar12._8_4_ + auVar14._8_4_;
            auVar24._12_4_ = auVar12._12_4_ + auVar14._12_4_;
            aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar24,ZEXT416((uint)uVar9),0x30);
            auVar12 = vminps_avx(auVar15._0_16_,(undefined1  [16])aVar3);
            auVar15 = ZEXT1664(auVar12);
            auVar12 = vmaxps_avx(auVar13._0_16_,(undefined1  [16])aVar4);
            auVar13 = ZEXT1664(auVar12);
            auVar25._0_4_ = aVar3.x + aVar4.x;
            auVar25._4_4_ = aVar3.y + aVar4.y;
            auVar25._8_4_ = aVar3.z + aVar4.z;
            auVar25._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
            auVar12 = vminps_avx(auVar18._0_16_,auVar25);
            auVar18 = ZEXT1664(auVar12);
            auVar12 = vmaxps_avx(auVar21._0_16_,auVar25);
            auVar21 = ZEXT1664(auVar12);
            sVar5 = sVar5 + 1;
            sVar6 = k + 1;
            prims[k].upper.field_0.field_1 = aVar4;
            prims[k].lower.field_0.field_1 = aVar3;
            uVar11 = r->_end;
          }
        }
      }
      aVar19 = auVar21._0_16_;
      aVar16 = auVar18._0_16_;
      aVar20 = auVar13._0_16_;
      aVar17 = auVar15._0_16_;
      uVar9 = uVar9 + 1;
      k = sVar6;
    } while (uVar9 < uVar11);
  }
  else {
    aVar17.m128[2] = INFINITY;
    aVar17._0_8_ = 0x7f8000007f800000;
    aVar17.m128[3] = INFINITY;
    aVar20.m128[2] = -INFINITY;
    aVar20._0_8_ = 0xff800000ff800000;
    aVar20.m128[3] = -INFINITY;
    sVar5 = 0;
    aVar16 = aVar17;
    aVar19 = aVar20;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar17;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar19;
  __return_storage_ptr__->end = sVar5;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }